

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

void __thiscall
google::protobuf::UnknownFieldSet::AddFixed32(UnknownFieldSet *this,int number,uint32_t value)

{
  char *pcVar1;
  ulong uVar2;
  bool is_soo;
  int old_size;
  int iVar3;
  char *pcVar4;
  long lVar5;
  
  uVar2 = (this->fields_).soo_rep_.field_0.long_rep.elements_int;
  old_size = internal::SooRep::size((SooRep *)this,(uVar2 & 4) == 0);
  iVar3 = 0;
  if ((undefined1  [16])((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4)
      != (undefined1  [16])0x0) {
    iVar3 = (this->fields_).soo_rep_.field_0.long_rep.capacity;
  }
  if (old_size == iVar3) {
    RepeatedField<google::protobuf::UnknownField>::Grow
              (&this->fields_,(uVar2 & 4) == 0,old_size,old_size + 1);
  }
  else if ((uVar2 & 4) == 0) {
    pcVar4 = (char *)((long)&(this->fields_).soo_rep_.field_0 + 8);
    is_soo = true;
    goto LAB_00481db1;
  }
  pcVar4 = internal::LongSooRep::elements((LongSooRep *)this);
  is_soo = false;
LAB_00481db1:
  iVar3 = internal::SooRep::size((SooRep *)this,is_soo);
  if ((iVar3 != old_size + 1) &&
     ((undefined1  [16])((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4)
      != (undefined1  [16])0x0)) {
    internal::LongSooRep::elements((LongSooRep *)this);
  }
  RepeatedField<google::protobuf::UnknownField>::set_size(&this->fields_,is_soo,old_size + 1);
  lVar5 = (long)iVar3 * 0x10;
  *(int *)(pcVar4 + lVar5) = number;
  pcVar1 = pcVar4 + lVar5 + 4;
  pcVar1[0] = '\x01';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  *(uint32_t *)(pcVar4 + lVar5 + 8) = value;
  return;
}

Assistant:

void UnknownFieldSet::AddFixed32(int number, uint32_t value) {
  auto& field = *fields_.Add();
  field.number_ = number;
  field.SetType(UnknownField::TYPE_FIXED32);
  field.data_.fixed32 = value;
}